

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

void notch::core::connect<notch::core::ABackpropLayer,notch::core::ALossLayer>
               (ABackpropLayer *prevLayer,ALossLayer *nextLayer)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar6;
  invalid_argument *this_00;
  GetShared<notch::core::ABackpropLayer> *access;
  ostringstream ss;
  char *local_1e8;
  long local_1e0;
  char local_1d8 [16];
  char *local_1c8;
  long local_1c0;
  char local_1b8 [16];
  element_type *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1a0;
  
  iVar3 = (*prevLayer->_vptr_ABackpropLayer[1])();
  iVar4 = (*prevLayer->_vptr_ABackpropLayer[2])(prevLayer);
  iVar5 = (*nextLayer->_vptr_ALossLayer[4])(nextLayer);
  (*nextLayer->_vptr_ALossLayer[5])(nextLayer);
  if (CONCAT44(extraout_var_00,iVar4) == CONCAT44(extraout_var_01,iVar5)) {
    SharedBuffers::allocate
              (&prevLayer->shared,CONCAT44(extraout_var,iVar3),CONCAT44(extraout_var_00,iVar4));
    (*prevLayer->_vptr_ABackpropLayer[5])(&local_1a8,prevLayer);
    p_Var2 = p_Stack_1a0;
    peVar1 = local_1a8;
    local_1a8 = (element_type *)0x0;
    p_Stack_1a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (nextLayer->shared).inputBuffer.
           super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (nextLayer->shared).inputBuffer.
    super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (nextLayer->shared).inputBuffer.
    super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      if (p_Stack_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1a0);
      }
    }
    return;
  }
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"can\'t connect ",0xe);
  (**prevLayer->_vptr_ABackpropLayer)(&local_1e8,prevLayer);
  poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1a8,local_1e8,local_1e0);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  poVar6 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," in/",4);
  poVar6 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," out",4);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," to ",4);
  (**nextLayer->_vptr_ALossLayer)(&local_1c8,nextLayer);
  poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_1c8,local_1c0);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  poVar6 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," in/",4);
  poVar6 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," out",4);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::stringbuf::str();
  ::std::invalid_argument::invalid_argument(this_00,(string *)&local_1e8);
  __cxa_throw(this_00,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument)
  ;
}

Assistant:

void connect(PREV_LAYER &prevLayer, NEXT_LAYER &nextLayer) {
    size_t prevIn = prevLayer.inputDim();
    size_t prevOut = prevLayer.outputDim();
    size_t nextIn = nextLayer.inputDim();
    size_t nextOut = nextLayer.outputDim();
    if (prevOut != nextIn) {
        std::ostringstream ss;
        ss << "can't connect " << prevLayer.tag() << " "
           << prevIn << " in/" << prevOut << " out"
           << " to " << nextLayer.tag() << " "
           << nextIn << " in/" << nextOut << " out";
        throw std::invalid_argument(ss.str());
    }
    GetShared<PREV_LAYER>::ref(prevLayer).allocate(prevIn, prevOut);
    GetShared<NEXT_LAYER>::ref(nextLayer).inputBuffer = prevLayer.getOutputBuffer();
}